

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

CappedArray<char,_5UL> kj::hex(unsigned_short i)

{
  char *pcVar1;
  ushort uVar2;
  char *pcVar3;
  byte *pbVar4;
  undefined6 in_register_0000003a;
  ulong uVar5;
  long lVar6;
  CappedArray<char,_5UL> CVar7;
  uint8_t reverse [4];
  CappedArray<char,_5UL> result;
  
  result.currentSize = 5;
  reverse[0] = '\0';
  reverse[1] = '\0';
  reverse[2] = '\0';
  reverse[3] = '\0';
  if ((int)CONCAT62(in_register_0000003a,i) == 0) {
    pbVar4 = reverse + 1;
    reverse[0] = '\0';
    reverse[1] = '\0';
    reverse[2] = '\0';
    reverse[3] = '\0';
  }
  else {
    pbVar4 = reverse;
    uVar5 = CONCAT62(in_register_0000003a,i);
    do {
      *pbVar4 = (byte)(uVar5 & 0xffff) & 0xf;
      pbVar4 = pbVar4 + 1;
      uVar2 = (ushort)uVar5;
      uVar5 = (uVar5 & 0xffff) >> 4;
    } while (0xf < uVar2);
  }
  pcVar1 = result.content;
  pcVar3 = pcVar1;
  if (reverse < pbVar4) {
    lVar6 = 0;
    do {
      *pcVar3 = "0123456789abcdef"[pbVar4[lVar6 + -1]];
      pcVar3 = pcVar3 + 1;
      lVar6 = lVar6 + -1;
    } while ((long)reverse - (long)pbVar4 != lVar6);
  }
  CVar7.currentSize = (long)pcVar3 - (long)pcVar1;
  CVar7._8_8_ = result._8_8_ & 0xffffffffff;
  return CVar7;
}

Assistant:

inline explicit constexpr CappedArray(size_t s): currentSize(s) {}